

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

bool __thiscall Clasp::DefaultMinimize::integrateBound(DefaultMinimize *this,Solver *s)

{
  bool bVar1;
  MinimizeMode MVar2;
  uint32 uVar3;
  size_type sVar4;
  int iVar5;
  uint32 uVar6;
  uint uVar7;
  Solver *this_00;
  wsum_t *pwVar8;
  Solver *in_RSI;
  Solver *in_RDI;
  uint32 *unaff_retaddr;
  undefined4 in_stack_00000008;
  PropMode in_stack_0000000c;
  undefined7 in_stack_00000010;
  bool in_stack_00000017;
  DefaultMinimize *in_stack_00000018;
  uint32 dl;
  uint32 x;
  WeightLiteral min;
  bool useTag;
  long in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint32 in_stack_ffffffffffffff94;
  undefined8 in_stack_ffffffffffffff98;
  SharedData *pSVar9;
  DefaultMinimize *in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa8;
  Solver *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  bool local_35;
  undefined4 in_stack_ffffffffffffffcc;
  undefined1 useTag_00;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  Literal in_stack_ffffffffffffffd8;
  Literal in_stack_ffffffffffffffdc;
  Solver *this_01;
  bool local_1;
  
  uVar6 = (uint32)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  useTag_00 = (undefined1)((uint)in_stack_ffffffffffffffcc >> 0x18);
  bVar1 = SharedMinimizeData::optimize
                    ((SharedMinimizeData *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  local_35 = false;
  if ((bVar1) &&
     (in_stack_ffffffffffffffbf = true, local_35 = (bool)in_stack_ffffffffffffffbf,
     *(uint *)&((Step *)&(in_RDI->stats).super_CoreStats.restarts)->field_0x4 >> 0x1e == 0)) {
    MVar2 = SharedMinimizeData::mode((SharedMinimizeData *)(in_RDI->model).ebo_.buf);
    in_stack_ffffffffffffffbf = MVar2 == enumOpt;
    local_35 = (bool)in_stack_ffffffffffffffbf;
  }
  bVar1 = MinimizeConstraint::prepare
                    ((MinimizeConstraint *)
                     CONCAT44(in_stack_ffffffffffffffdc.rep_,in_stack_ffffffffffffffd8.rep_),
                     (Solver *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (bool)useTag_00);
  if (bVar1) {
    this_01 = in_RSI;
    if (local_35 != false) {
      Literal::var((Literal *)&(in_RDI->model).ebo_.size);
      uVar3 = Solver::level((Solver *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            (Var)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      in_stack_ffffffffffffffb0 = in_RSI;
      if (uVar3 == 0) {
        *(uint *)&((Step *)&(in_RDI->stats).super_CoreStats.restarts)->field_0x4 =
             *(uint *)&((Step *)&(in_RDI->stats).super_CoreStats.restarts)->field_0x4 & 0x3fffffff;
        stepInit(in_stack_ffffffffffffffa0,uVar6);
        in_stack_ffffffffffffffb0 = in_RSI;
      }
    }
    bVar1 = active((DefaultMinimize *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
    ;
    if ((!bVar1) ||
       (bVar1 = SharedMinimizeData::checkNext
                          ((SharedMinimizeData *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)), bVar1)) {
      lit_true();
      bVar1 = bk_lib::
              pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
              ::empty(&((SharedData *)(in_RDI->model).ebo_.buf)->weights);
      if (bVar1) {
        iVar5 = 0;
      }
      else {
        sVar4 = bk_lib::
                pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                ::size(&((SharedData *)(in_RDI->model).ebo_.buf)->weights);
        iVar5 = sVar4 - 1;
      }
      std::pair<Clasp::Literal,_int>::pair<Clasp::Literal,_unsigned_int,_true>
                ((pair<Clasp::Literal,_int> *)&stack0xffffffffffffffdc,
                 (Literal *)&stack0xffffffffffffffd8,(uint *)&stack0xffffffffffffffd4);
      while( true ) {
        bVar1 = Solver::hasConflict((Solver *)0x1af753);
        in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 & 0xffffff;
        if (!bVar1) {
          SharedMinimizeData::checkNext
                    ((SharedMinimizeData *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          bVar1 = updateBounds(in_stack_00000018,in_stack_00000017);
          in_stack_ffffffffffffffa8 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffa8);
        }
        uVar6 = (uint32)((ulong)in_stack_ffffffffffffff88 >> 0x20);
        if ((char)(in_stack_ffffffffffffffa8 >> 0x18) == '\0') break;
        uVar6 = Solver::decisionLevel((Solver *)0x1af7a1);
        uVar6 = uVar6 + 1;
        pSVar9 = (SharedData *)(in_RDI->model).ebo_.buf;
        this_00 = (Solver *)sum((DefaultMinimize *)in_RDI);
        opt((DefaultMinimize *)in_RDI);
        bVar1 = SharedMinimizeData::imp
                          ((SharedMinimizeData *)in_RDI,
                           (wsum_t *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                           (WeightLiteral *)in_stack_ffffffffffffffb0,
                           (wsum_t *)CONCAT44(iVar5,in_stack_ffffffffffffffa8),(uint32 *)this_00);
        if (bVar1) {
          in_stack_ffffffffffffff94 =
               computeImplicationSet
                         (in_stack_00000018,(Solver *)CONCAT17(in_stack_00000017,in_stack_00000010),
                          (WeightLiteral *)CONCAT44(in_stack_0000000c,in_stack_00000008),
                          unaff_retaddr);
          uVar6 = in_stack_ffffffffffffff94;
          uVar3 = Solver::rootLevel(this_01);
          if (uVar3 < in_stack_ffffffffffffff94) goto LAB_001af829;
        }
        else {
LAB_001af829:
          uVar7 = uVar6 - 1;
          while( true ) {
            bVar1 = Solver::hasConflict((Solver *)0x1af83e);
            in_stack_ffffffffffffff90 = CONCAT13(1,(int3)in_stack_ffffffffffffff90);
            if (bVar1) {
              bVar1 = Solver::resolveConflict
                                ((Solver *)CONCAT44(in_stack_0000000c,in_stack_00000008));
              in_stack_ffffffffffffff90 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff90);
            }
            if ((char)((uint)in_stack_ffffffffffffff90 >> 0x18) == '\0') break;
            uVar6 = Solver::undoUntil(this_00,(uint32)((ulong)pSVar9 >> 0x20),(uint32)pSVar9);
            if (uVar7 < uVar6) {
              Solver::backtrack(this_01);
            }
            else {
              bVar1 = propagateImpl(in_stack_00000018,
                                    (Solver *)CONCAT17(in_stack_00000017,in_stack_00000010),
                                    in_stack_0000000c);
              if (bVar1) {
                return true;
              }
            }
          }
        }
        bVar1 = SharedMinimizeData::checkNext
                          ((SharedMinimizeData *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        uVar6 = (uint32)((ulong)in_stack_ffffffffffffff88 >> 0x20);
        if (!bVar1) break;
        if (*(uint *)((CounterType *)&(in_RDI->stats).super_CoreStats.restarts + 1) >> 0x1e == 0) {
          ((CounterType *)&(in_RDI->stats).super_CoreStats.restarts)[1] =
               (CounterType)
               (*(uint *)((CounterType *)&(in_RDI->stats).super_CoreStats.restarts + 1) & 0xc0000000
               | (*(uint *)((CounterType *)&(in_RDI->stats).super_CoreStats.restarts + 1) &
                 0x3fffffff) + 1 & 0x3fffffff);
        }
        else {
          pwVar8 = opt((DefaultMinimize *)in_RDI);
          uVar7 = *(uint *)&((Step *)&(in_RDI->stats).super_CoreStats.restarts)->field_0x4 &
                  0x3fffffff;
          in_stack_ffffffffffffff88 = pwVar8[uVar7] + 1;
          pwVar8[uVar7] = in_stack_ffffffffffffff88;
          pwVar8 = stepLow((DefaultMinimize *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          *pwVar8 = in_stack_ffffffffffffff88;
        }
      }
      relaxBound((DefaultMinimize *)in_stack_ffffffffffffffb0,SUB41((uint)iVar5 >> 0x18,0));
      bVar1 = Solver::hasConflict((Solver *)0x1af950);
      if (!bVar1) {
        Solver::undoUntil((Solver *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          uVar6);
        Solver::setStopConflict(in_RDI);
      }
      local_1 = false;
    }
    else {
      bVar1 = Solver::hasConflict((Solver *)0x1af6dc);
      local_1 = (bool)((bVar1 ^ 0xffU) & 1);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool DefaultMinimize::integrateBound(Solver& s) {
	bool useTag = shared_->optimize() && (step_.type != 0 || shared_->mode() == MinimizeMode_t::enumOpt);
	if (!prepare(s, useTag)) { return false; }
	if (useTag && s.level(tag_.var()) == 0) {
		step_.type = 0;
		stepInit(0);
	}
	if ((active() && !shared_->checkNext())) { return !s.hasConflict(); }
	WeightLiteral min(lit_true(), shared_->weights.empty() ? uint32(0) : (uint32)shared_->weights.size()-1);
	while (!s.hasConflict() && updateBounds(shared_->checkNext())) {
		uint32 x = 0;
		uint32 dl= s.decisionLevel() + 1;
		if (!STRATEGY(imp(sum(), min, opt(), actLev_)) || (dl = computeImplicationSet(s, min, x)) > s.rootLevel()) {
			for (--dl; !s.hasConflict() || s.resolveConflict(); ) {
				if      (s.undoUntil(dl, Solver::undo_pop_bt_level) > dl){ s.backtrack(); }
				else if (propagateImpl(s, propagate_new_opt))            { return true;   }
			}
		}
		if (!shared_->checkNext()) {
			break;
		}
		if (!step_.type) { ++step_.lev; }
		else             { stepLow() = ++opt()[step_.lev]; }
	}
	relaxBound(false);
	if (!s.hasConflict()) {
		s.undoUntil(0);
		s.setStopConflict();
	}
	return false;
}